

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathExtras.h
# Opt level: O0

size_t llvm::detail::LeadingZerosCounter<unsigned_long,_8UL>::count
                 (unsigned_long Val,ZeroBehavior ZB)

{
  long lVar1;
  ZeroBehavior ZB_local;
  unsigned_long Val_local;
  
  if ((ZB == ZB_Undefined) || (Val != 0)) {
    lVar1 = 0x3f;
    if (Val != 0) {
      for (; Val >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    Val_local = (unsigned_long)(int)((uint)lVar1 ^ 0x3f);
  }
  else {
    Val_local = 0x40;
  }
  return Val_local;
}

Assistant:

static std::size_t count(T Val, ZeroBehavior ZB) {
    if (ZB != ZB_Undefined && Val == 0)
      return 64;

#if __has_builtin(__builtin_clzll) || LLVM_GNUC_PREREQ(4, 0, 0)
    return __builtin_clzll(Val);
#elif defined(_MSC_VER)
    unsigned long Index;
    _BitScanReverse64(&Index, Val);
    return Index ^ 63;
#endif
  }